

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_start(ipc_pipe *p,nng_stream *conn,ipc_ep *ep)

{
  nni_aio *aio;
  uint16_t uVar1;
  undefined1 local_30 [8];
  nni_iov iov;
  
  p->conn = conn;
  p->ep = ep;
  uVar1 = ep->proto;
  p->proto = uVar1;
  local_30 = (undefined1  [8])p->tx_head;
  p->tx_head[0] = '\0';
  p->tx_head[1] = 'S';
  p->tx_head[2] = 'P';
  p->tx_head[3] = '\0';
  p->tx_head[4] = (uint8_t)(uVar1 >> 8);
  p->tx_head[5] = (uint8_t)uVar1;
  p->tx_head[6] = '\0';
  p->tx_head[7] = '\0';
  p->got_tx_head = 0;
  p->got_rx_head = 0;
  p->want_rx_head = 8;
  p->want_tx_head = 8;
  iov.iov_buf = (void *)0x8;
  aio = &p->neg_aio;
  nni_aio_set_iov(aio,1,(nni_iov *)local_30);
  nni_list_append(&ep->nego_pipes,p);
  nni_aio_set_timeout(aio,10000);
  nng_stream_send(p->conn,aio);
  return;
}

Assistant:

static void
ipc_pipe_start(ipc_pipe *p, nng_stream *conn, ipc_ep *ep)
{
	nni_iov iov;

	p->conn  = conn;
	p->ep    = ep;
	p->proto = ep->proto;

	p->tx_head[0] = 0;
	p->tx_head[1] = 'S';
	p->tx_head[2] = 'P';
	p->tx_head[3] = 0;
	NNI_PUT16(&p->tx_head[4], p->proto);
	NNI_PUT16(&p->tx_head[6], 0);

	p->got_rx_head  = 0;
	p->got_tx_head  = 0;
	p->want_rx_head = 8;
	p->want_tx_head = 8;
	iov.iov_len     = 8;
	iov.iov_buf     = &p->tx_head[0];
	nni_aio_set_iov(&p->neg_aio, 1, &iov);
	nni_list_append(&ep->nego_pipes, p);

	nni_aio_set_timeout(&p->neg_aio, 10000); // 10 sec timeout to negotiate
	nng_stream_send(p->conn, &p->neg_aio);
}